

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O2

bool __thiscall
google::protobuf::compiler::Parser::ParseUninterpretedBlock(Parser *this,string *value)

{
  bool bVar1;
  int iVar2;
  string_view text;
  string_view text_00;
  string_view text_01;
  
  text._M_str = "{";
  text._M_len = 1;
  bVar1 = Consume(this,text);
  if (bVar1) {
    iVar2 = 1;
    while ((this->input_->current_).type != TYPE_END) {
      text_00._M_str = "{";
      text_00._M_len = 1;
      bVar1 = LookingAt(this,text_00);
      if (bVar1) {
        iVar2 = iVar2 + 1;
      }
      else {
        text_01._M_str = "}";
        text_01._M_len = 1;
        bVar1 = LookingAt(this,text_01);
        if ((bVar1) && (iVar2 = iVar2 + -1, iVar2 == 0)) {
          io::Tokenizer::Next(this->input_);
          return true;
        }
      }
      if (value->_M_string_length != 0) {
        std::__cxx11::string::push_back((char)value);
      }
      std::__cxx11::string::append((string *)value);
      io::Tokenizer::Next(this->input_);
    }
    RecordError(this,(ErrorMaker)ZEXT816(0x105bfe3));
  }
  return false;
}

Assistant:

bool Parser::ParseUninterpretedBlock(std::string* value) {
  // Note that enclosing braces are not added to *value.
  // We do NOT use ConsumeEndOfStatement for this brace because it's delimiting
  // an expression, not a block of statements.
  DO(Consume("{"));
  int brace_depth = 1;
  while (!AtEnd()) {
    if (LookingAt("{")) {
      brace_depth++;
    } else if (LookingAt("}")) {
      brace_depth--;
      if (brace_depth == 0) {
        input_->Next();
        return true;
      }
    }
    // TODO: Interpret line/column numbers to preserve formatting
    if (!value->empty()) value->push_back(' ');
    value->append(input_->current().text);
    input_->Next();
  }
  RecordError("Unexpected end of stream while parsing aggregate value.");
  return false;
}